

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.cpp
# Opt level: O2

vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> * __thiscall
libDAI::NDP::beliefs
          (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
           *__return_storage_ptr__,NDP *this)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "makes no sense?";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

vector<Factor> NDP::beliefs() const {
        throw("makes no sense?");
        vector<Factor> f; 
        return(f);
/*        
        vector<Factor> result;
        for( size_t i = 0; i < grm().nrVars(); i++ )
            result.push_back( beliefV(i) );
        for( size_t I = 0; I < grm().nrFactors(); I++ )
            result.push_back( beliefF(I) );
        return result;
*/
    }